

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O2

unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true> __thiscall
duckdb::DetachInfo::Deserialize(DetachInfo *this,Deserializer *deserializer)

{
  DetachInfo *this_00;
  pointer pDVar1;
  _Head_base<0UL,_duckdb::DetachInfo_*,_false> local_20;
  
  this_00 = (DetachInfo *)operator_new(0x38);
  DetachInfo(this_00);
  local_20._M_head_impl = this_00;
  pDVar1 = unique_ptr<duckdb::DetachInfo,_std::default_delete<duckdb::DetachInfo>,_true>::operator->
                     ((unique_ptr<duckdb::DetachInfo,_std::default_delete<duckdb::DetachInfo>,_true>
                       *)&local_20);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>(deserializer,200,"name",&pDVar1->name)
  ;
  pDVar1 = unique_ptr<duckdb::DetachInfo,_std::default_delete<duckdb::DetachInfo>,_true>::operator->
                     ((unique_ptr<duckdb::DetachInfo,_std::default_delete<duckdb::DetachInfo>,_true>
                       *)&local_20);
  Deserializer::ReadProperty<duckdb::OnEntryNotFound>
            (deserializer,0xc9,"if_not_found",&pDVar1->if_not_found);
  (this->super_ParseInfo)._vptr_ParseInfo = (_func_int **)local_20._M_head_impl;
  return (unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>)
         (unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>)this;
}

Assistant:

unique_ptr<ParseInfo> DetachInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<DetachInfo>(new DetachInfo());
	deserializer.ReadPropertyWithDefault<string>(200, "name", result->name);
	deserializer.ReadProperty<OnEntryNotFound>(201, "if_not_found", result->if_not_found);
	return std::move(result);
}